

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
HTTPRequest::GetHeader
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,HTTPRequest *this,string *hdr)

{
  long lVar1;
  char *__s;
  allocator<char> *__a;
  long in_FS_OFFSET;
  allocator<char> local_1a;
  allocator<char> local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = evhttp_request_get_input_headers(this->req);
  if (lVar1 == 0) {
    __assert_fail("headers",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                  ,0x25c,
                  "std::pair<bool, std::string> HTTPRequest::GetHeader(const std::string &) const");
  }
  __s = (char *)evhttp_find_header(lVar1,(hdr->_M_dataplus)._M_p);
  if (__s == (char *)0x0) {
    __return_storage_ptr__->first = false;
    __s = "";
    __a = &local_19;
  }
  else {
    __return_storage_ptr__->first = true;
    __a = &local_1a;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->second,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<bool, std::string> HTTPRequest::GetHeader(const std::string& hdr) const
{
    const struct evkeyvalq* headers = evhttp_request_get_input_headers(req);
    assert(headers);
    const char* val = evhttp_find_header(headers, hdr.c_str());
    if (val)
        return std::make_pair(true, val);
    else
        return std::make_pair(false, "");
}